

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
toml::ok<std::__cxx11::string&>
          (success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,toml *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,*(long *)this,*(long *)(this + 8) + *(long *)this);
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = local_38;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  (__return_storage_ptr__->value)._M_string_length = local_30;
  return __return_storage_ptr__;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}